

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O1

void list_store_doinsert(t_list_store *x,t_symbol *s,int argc,t_atom *argv,int index)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  t_listelem *ptVar5;
  t_gpointer *ptVar6;
  t_listelem *ptVar7;
  int iVar8;
  int iVar9;
  
  ptVar7 = (x->x_alist).l_vec;
  lVar4 = (long)(x->x_alist).l_n;
  iVar8 = (int)s;
  ptVar5 = (t_listelem *)resizebytes(ptVar7,lVar4 * 0x28,(lVar4 + iVar8) * 0x28);
  (x->x_alist).l_vec = ptVar5;
  if (ptVar5 != (t_listelem *)0x0) {
    if (((ptVar5 != ptVar7) && ((x->x_alist).l_npointer != 0)) &&
       (iVar2 = (x->x_alist).l_n, iVar2 != 0)) {
      ptVar7 = (x->x_alist).l_vec;
      do {
        ptVar6 = &ptVar7->l_p;
        if (*(int *)((long)(ptVar6 + -1) + 8) == 3) {
          *(t_gpointer **)((long)(ptVar6 + -1) + 0x10) = ptVar6;
        }
        iVar2 = iVar2 + -1;
        ptVar7 = (t_listelem *)(ptVar6 + 1);
      } while (iVar2 != 0);
    }
    iVar2 = (x->x_alist).l_n;
    iVar9 = (int)argv;
    iVar3 = iVar2 - iVar9;
    if (iVar3 != 0 && iVar9 <= iVar2) {
      ptVar7 = (x->x_alist).l_vec + iVar9;
      memmove(ptVar7 + iVar8,ptVar7,(long)iVar3 * 0x28);
      if (((x->x_alist).l_npointer != 0) && (iVar2 = (x->x_alist).l_n, iVar2 != iVar9)) {
        iVar2 = iVar9 - iVar2;
        ptVar7 = (x->x_alist).l_vec + (iVar9 + iVar8);
        do {
          ptVar6 = &ptVar7->l_p;
          if (*(int *)((long)(ptVar6 + -1) + 8) == 3) {
            *(t_gpointer **)((long)(ptVar6 + -1) + 0x10) = ptVar6;
          }
          ptVar7 = (t_listelem *)(ptVar6 + 1);
          iVar2 = iVar2 + 1;
        } while (iVar2 != 0);
      }
    }
    alist_copyin(&x->x_alist,(t_symbol *)((ulong)s & 0xffffffff),argc,
                 (t_atom *)((ulong)argv & 0xffffffff),index);
    piVar1 = &(x->x_alist).l_n;
    *piVar1 = *piVar1 + iVar8;
    return;
  }
  (x->x_alist).l_n = 0;
  pd_error((void *)0x0,"list: out of memory");
  return;
}

Assistant:

static void list_store_doinsert(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv, int index)
{
    t_listelem *oldptr = x->x_alist.l_vec;
        /* try to allocate more memory */
    if (!(x->x_alist.l_vec = (t_listelem *)resizebytes(x->x_alist.l_vec,
        (x->x_alist.l_n) * sizeof(*x->x_alist.l_vec),
        (x->x_alist.l_n + argc) * sizeof(*x->x_alist.l_vec))))
    {
        x->x_alist.l_n = 0;
        pd_error(0, "list: out of memory");
        return;
    }
        /* fix gpointers in case resizebytes() has moved the alist in memory */
    if (x->x_alist.l_vec != oldptr && x->x_alist.l_npointer)
        alist_restore_gpointers(&x->x_alist, 0, x->x_alist.l_n);
        /* shift existing elements after 'index' to the right */
    if (index < x->x_alist.l_n)
    {
        memmove(x->x_alist.l_vec + index + argc, x->x_alist.l_vec + index,
            (x->x_alist.l_n - index) * sizeof(*x->x_alist.l_vec));
            /* fix gpointers because of memmove() */
        if (x->x_alist.l_npointer)
            alist_restore_gpointers(&x->x_alist, index + argc, x->x_alist.l_n - index);
    }
        /* finally copy new elements */
    alist_copyin(&x->x_alist, s, argc, argv, index);
    x->x_alist.l_n += argc;
}